

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::URLDecode
                   (string *__return_storage_ptr__,string *input,bool plus_to_space)

{
  idx_t __n;
  tuple<char_*,_std::default_delete<char[]>_> output;
  unique_ptr<char[],_std::default_delete<char>,_true> result_data;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_30;
  
  __n = URLDecodeSize((input->_M_dataplus)._M_p,input->_M_string_length,plus_to_space);
  output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(__n);
  switchD_016d4fed::default
            ((void *)output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
  local_30._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  URLDecodeBuffer((input->_M_dataplus)._M_p,input->_M_string_length,
                  (char *)output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl,plus_to_space);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             output.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (char *)(__n + (long)output.
                                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                  super__Head_base<0UL,_char_*,_false>._M_head_impl));
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::URLDecode(const string &input, bool plus_to_space) {
	idx_t result_size = URLDecodeSize(input.c_str(), input.size(), plus_to_space);
	auto result_data = make_uniq_array<char>(result_size);
	URLDecodeBuffer(input.c_str(), input.size(), result_data.get(), plus_to_space);
	return string(result_data.get(), result_size);
}